

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ConditionalPropertyExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ConditionalPropertyExprSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *pSVar1;
  size_t index_local;
  ConditionalPropertyExprSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->ifKeyword).kind;
    token._2_1_ = (this->ifKeyword).field_0x2;
    token.numFlags.raw = (this->ifKeyword).numFlags.raw;
    token.rawLen = (this->ifKeyword).rawLen;
    token.info = (this->ifKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->condition)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  case 3:
    token_01.kind = (this->closeParen).kind;
    token_01._2_1_ = (this->closeParen).field_0x2;
    token_01.numFlags.raw = (this->closeParen).numFlags.raw;
    token_01.rawLen = (this->closeParen).rawLen;
    token_01.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    pSVar1 = &not_null<slang::syntax::PropertyExprSyntax_*>::get(&this->expr)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  case 5:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->elseClause->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ConditionalPropertyExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return ifKeyword;
        case 1: return openParen;
        case 2: return condition.get();
        case 3: return closeParen;
        case 4: return expr.get();
        case 5: return elseClause;
        default: return nullptr;
    }
}